

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token.c
# Opt level: O2

void open_file(char *file,char **search_dirs)

{
  FILE *fp;
  char buf [4096];
  char acStack_1038 [4104];
  
  if (0x1f < file_stack_ptr) {
    fatal_input_error("Too many levels of nested #include\'s.\n");
  }
  if ((search_dirs == (char **)0x0) || (*file == '/')) {
    fp = fopen(file,"r");
    if (fp == (FILE *)0x0) {
LAB_00105f0d:
      fp = (FILE *)0x0;
      fatal_input_error("%s: No such file or directory.\n",file);
    }
  }
  else {
    do {
      if (*search_dirs == (char *)0x0) goto LAB_00105f0d;
      sprintf(acStack_1038,"%s/%s",*search_dirs,file);
      fp = fopen(acStack_1038,"r");
      search_dirs = search_dirs + 1;
    } while (fp == (FILE *)0x0);
  }
  open_stream(file,(FILE *)fp);
  return;
}

Assistant:

void
open_file (const char *file, const char *search_dirs[])
{
  FILE *fp;
  const char **dir;
  char buf[4096];
  
  /* See if we've opened too many files already. */
  if (file_stack_ptr >= MAX_INCLUDE_DEPTH)
    fatal_input_error ("Too many levels of nested #include's.\n");

  /* If the filename has a leading slash, don't check directories.
   * Otherwise, check all the directories in the search path.
   */
  fp = NULL;
  if (file[0] == '/' || !search_dirs)
    fp = fopen (file, "r");
  else for (dir = &search_dirs[0]; *dir != NULL; dir++)
    {
      sprintf (buf, "%s/%s", *dir, file);
      fp = fopen (buf, "r");
      if (fp != NULL)
	break;
    }
  if (fp == NULL)
    fatal_input_error ("%s: No such file or directory.\n", file);

  open_stream (file, fp);
}